

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  ImVec2 IVar4;
  ImDrawVert *pIVar5;
  long lVar6;
  long lVar7;
  undefined4 in_EAX;
  uint *puVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  int i1;
  long lVar13;
  uint uVar14;
  int iVar15;
  bool bVar16;
  float fVar17;
  float fVar20;
  ImVec2 IVar18;
  ImVec2 IVar19;
  float fVar21;
  float fVar22;
  float afStack_38 [2];
  
  if (2 < points_count) {
    IVar4 = this->_Data->TexUvWhitePixel;
    if ((this->Flags & 2) == 0) {
      PrimReserve(this,points_count * 3 + -6,points_count);
      for (uVar10 = 0; (uint)points_count != uVar10; uVar10 = uVar10 + 1) {
        this->_VtxWritePtr->pos = points[uVar10];
        this->_VtxWritePtr->uv = IVar4;
        pIVar5 = this->_VtxWritePtr;
        pIVar5->col = col;
        this->_VtxWritePtr = pIVar5 + 1;
      }
      puVar8 = this->_IdxWritePtr;
      for (iVar9 = 2; uVar3 = this->_VtxCurrentIdx, points_count != iVar9; iVar9 = iVar9 + 1) {
        *puVar8 = uVar3;
        puVar8[1] = (uVar3 + iVar9) - 1;
        puVar8[2] = this->_VtxCurrentIdx + iVar9;
        puVar8 = puVar8 + 3;
        this->_IdxWritePtr = puVar8;
      }
      this->_VtxCurrentIdx = uVar3 + points_count;
    }
    else {
      afStack_38[1] = (float)(points_count * 2);
      afStack_38[0] = (float)in_EAX;
      PrimReserve(this,points_count * 9 + -6,points_count * 2);
      uVar3 = this->_VtxCurrentIdx;
      puVar8 = this->_IdxWritePtr;
      iVar9 = points_count + -2;
      uVar11 = uVar3 + 2;
      while (bVar16 = iVar9 != 0, iVar9 = iVar9 + -1, bVar16) {
        *puVar8 = uVar3;
        puVar8[1] = uVar11;
        uVar11 = uVar11 + 2;
        puVar8[2] = uVar11;
        puVar8 = puVar8 + 3;
        this->_IdxWritePtr = puVar8;
      }
      uVar10 = (ulong)(uint)points_count;
      lVar6 = -(uVar10 * 8 + 0xf & 0xfffffffffffffff0);
      lVar7 = lVar6 + -0x38;
      iVar15 = points_count + -1;
      iVar9 = iVar15;
      for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
        lVar13 = (long)iVar9;
        fVar17 = points[uVar12].x - points[lVar13].x;
        fVar20 = points[uVar12].y - points[lVar13].y;
        fVar21 = fVar17 * fVar17 + fVar20 * fVar20;
        if (0.0 < fVar21) {
          fVar21 = 1.0 / SQRT(fVar21);
          fVar17 = fVar17 * fVar21;
          fVar20 = fVar20 * fVar21;
        }
        *(float *)((long)afStack_38 + lVar13 * 8 + lVar7 + 0x38) = fVar20;
        *(float *)((long)afStack_38 + lVar13 * 8 + lVar6 + 4) = -fVar17;
        iVar9 = (int)uVar12;
      }
      uVar11 = uVar3;
      for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
        pIVar5 = this->_VtxWritePtr;
        uVar1 = *(undefined8 *)((long)afStack_38 + (long)iVar15 * 8 + lVar7 + 0x38);
        uVar2 = *(undefined8 *)((long)afStack_38 + uVar12 * 8 + lVar7 + 0x38);
        fVar20 = ((float)uVar2 + (float)uVar1) * 0.5;
        fVar21 = ((float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20)) * 0.5;
        fVar22 = fVar20 * fVar20 + fVar21 * fVar21;
        fVar17 = 0.5;
        if (0.5 <= fVar22) {
          fVar17 = fVar22;
        }
        fVar20 = (1.0 / fVar17) * fVar20 * 0.5;
        fVar17 = (1.0 / fVar17) * fVar21 * 0.5;
        IVar18.x = points[uVar12].x - fVar20;
        IVar18.y = points[uVar12].y - fVar17;
        pIVar5->pos = IVar18;
        pIVar5->uv = IVar4;
        pIVar5 = this->_VtxWritePtr;
        pIVar5->col = col;
        IVar19.x = points[uVar12].x + fVar20;
        IVar19.y = points[uVar12].y + fVar17;
        pIVar5[1].pos = IVar19;
        pIVar5[1].uv = IVar4;
        pIVar5 = this->_VtxWritePtr;
        pIVar5[1].col = col & 0xffffff;
        this->_VtxWritePtr = pIVar5 + 2;
        puVar8 = this->_IdxWritePtr;
        *puVar8 = uVar11;
        puVar8[1] = uVar3 + iVar15 * 2;
        uVar14 = uVar3 + 1 + iVar15 * 2;
        puVar8[2] = uVar14;
        puVar8[3] = uVar14;
        puVar8[4] = uVar11 + 1;
        puVar8[5] = uVar11;
        this->_IdxWritePtr = puVar8 + 6;
        iVar15 = (int)uVar12;
        uVar11 = uVar11 + 2;
      }
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (int)afStack_38[1];
    }
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count-2)*3 + points_count*6;
        const int vtx_count = (points_count*2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx+1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+((i-1)<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx+(i<<1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2)); //-V630
        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx+(i1<<1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+(i0<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx+(i0<<1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx+(i0<<1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx+(i1<<1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx+(i1<<1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count-2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+i-1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}